

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

walk_result __thiscall
jsoncons::jsonschema::
maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
do_validate(maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *context,
           basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *instance,
           json_pointer *instance_location,evaluation_results *param_5,error_reporter *reporter,
           basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *param_7)

{
  bool bVar1;
  semantic_tag sVar2;
  walk_result wVar3;
  type_conflict6 tVar4;
  type_conflict6 tVar5;
  type_conflict2 tVar6;
  type_conflict2 tVar7;
  json_pointer *pjVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 in_RCX;
  keyword_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>> *in_RDI;
  validation_message *in_R9;
  type_conflict1 tVar9;
  type_conflict1 tVar10;
  walk_result result_3;
  walk_result result_2;
  bigint n2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s2;
  bigint n1;
  string_view_type sv1;
  walk_result result_1;
  walk_result result;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  this_context;
  undefined4 in_stack_fffffffffffff878;
  undefined4 in_stack_fffffffffffff87c;
  validation_message *in_stack_fffffffffffff880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff888;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffff898;
  string *in_stack_fffffffffffff8a0;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffff8e0;
  string local_678 [32];
  string local_658 [24];
  size_type in_stack_fffffffffffff9c0;
  char *in_stack_fffffffffffff9c8;
  string local_518 [32];
  string local_4f8 [32];
  undefined1 local_4d8 [284];
  walk_result local_3bc;
  string local_390 [72];
  string_view_type local_348;
  string local_338 [32];
  string local_318 [32];
  undefined1 local_2f8 [280];
  walk_result local_1e0;
  int local_1dc;
  string local_1d8 [32];
  string local_1b8 [32];
  undefined1 local_198 [280];
  walk_result local_80;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> local_70
  ;
  validation_message *local_38;
  undefined8 local_28;
  walk_result local_4;
  
  local_38 = in_R9;
  local_28 = in_RCX;
  keyword_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
  keyword_name_abi_cxx11_(in_RDI);
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  eval_context((eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_int64
                    (in_stack_fffffffffffff898);
  if ((bVar1) &&
     (bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_int64
                        (in_stack_fffffffffffff898), bVar1)) {
    tVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<long>
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       in_stack_fffffffffffff880);
    tVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<long>
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       in_stack_fffffffffffff880);
    if (tVar5 < tVar4) {
      pjVar8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               ::eval_path(&local_70);
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as<std::__cxx11::string>
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 in_stack_fffffffffffff888);
      std::operator+(in_stack_fffffffffffff888,&in_stack_fffffffffffff880->keyword_);
      (**(code **)(*(long *)in_RDI + 0x10))(local_198,in_RDI,pjVar8,local_28,local_1b8);
      wVar3 = error_reporter::error
                        ((error_reporter *)in_stack_fffffffffffff880,
                         (validation_message *)
                         CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
      validation_message::~validation_message(in_stack_fffffffffffff880);
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::~string(local_1d8);
      local_80 = wVar3;
      if (wVar3 == abort) {
        local_1dc = 1;
        local_4 = abort;
        goto LAB_00829eaf;
      }
    }
  }
  else {
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_uint64
                      (in_stack_fffffffffffff898);
    if ((bVar1) &&
       (bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_uint64
                          (in_stack_fffffffffffff898), bVar1)) {
      tVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<unsigned_long>
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         in_stack_fffffffffffff880);
      tVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<unsigned_long>
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         in_stack_fffffffffffff880);
      if (tVar7 < tVar6) {
        pjVar8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 ::eval_path(&local_70);
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as<std::__cxx11::string>
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   in_stack_fffffffffffff888);
        std::operator+(in_stack_fffffffffffff888,&in_stack_fffffffffffff880->keyword_);
        (**(code **)(*(long *)in_RDI + 0x10))(local_2f8,in_RDI,pjVar8,local_28,local_318);
        wVar3 = error_reporter::error
                          ((error_reporter *)in_stack_fffffffffffff880,
                           (validation_message *)
                           CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
        validation_message::~validation_message(in_stack_fffffffffffff880);
        std::__cxx11::string::~string(local_318);
        std::__cxx11::string::~string(local_338);
        local_1e0 = wVar3;
        if (wVar3 == abort) {
          local_1dc = 1;
          local_4 = abort;
          goto LAB_00829eaf;
        }
      }
    }
    else {
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string_view
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         0x829956);
      if ((bVar1) &&
         (sVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::tag
                            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             in_stack_fffffffffffff888), sVar2 == bigint)) {
        local_348 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                              (in_stack_fffffffffffff8e0);
        std::basic_string_view<char,_std::char_traits<char>_>::data(&local_348);
        std::basic_string_view<char,_std::char_traits<char>_>::length(&local_348);
        basic_bigint<std::allocator<unsigned_char>_>::from_string<char>
                  (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        as_string<std::allocator<char>>
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8a8);
        std::__cxx11::string::data();
        std::__cxx11::string::length();
        basic_bigint<std::allocator<unsigned_char>_>::from_string<char>
                  (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
        bVar1 = operator>((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffff880,
                          (basic_bigint<std::allocator<unsigned_char>_> *)
                          CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
        if (bVar1) {
          pjVar8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   ::eval_path(&local_70);
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as<std::__cxx11::string>
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffff888);
          std::operator+(in_stack_fffffffffffff888,&in_stack_fffffffffffff880->keyword_);
          (**(code **)(*(long *)in_RDI + 0x10))(local_4d8,in_RDI,pjVar8,local_28,local_4f8);
          wVar3 = error_reporter::error
                            ((error_reporter *)in_stack_fffffffffffff880,
                             (validation_message *)
                             CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
          validation_message::~validation_message(in_stack_fffffffffffff880);
          std::__cxx11::string::~string(local_4f8);
          std::__cxx11::string::~string(local_518);
          local_3bc = wVar3;
          if (wVar3 != abort) goto LAB_00829c3d;
          local_1dc = 1;
          local_4 = abort;
        }
        else {
LAB_00829c3d:
          local_1dc = 0;
        }
        basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                  ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffff880);
        std::__cxx11::string::~string(local_390);
        basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint
                  ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffff880);
        if (local_1dc != 0) goto LAB_00829eaf;
      }
      else {
        bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                          (in_stack_fffffffffffff898);
        if (bVar1) {
          tVar9 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<double>
                            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             in_stack_fffffffffffff880);
          tVar10 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<double>
                             ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                              in_stack_fffffffffffff880);
          if (tVar10 < tVar9) {
            __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ::eval_path(&local_70);
            basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as<std::__cxx11::string>
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)__lhs);
            std::operator+(__lhs,&local_38->keyword_);
            (**(code **)(*(long *)in_RDI + 0x10))
                      (&stack0xfffffffffffff9c8,in_RDI,__lhs,local_28,local_658);
            wVar3 = error_reporter::error
                              ((error_reporter *)local_38,
                               (validation_message *)
                               CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
            validation_message::~validation_message(local_38);
            std::__cxx11::string::~string(local_658);
            std::__cxx11::string::~string(local_678);
            in_stack_fffffffffffff880 = local_38;
            if (wVar3 == abort) {
              local_1dc = 1;
              local_4 = abort;
              goto LAB_00829eaf;
            }
          }
        }
      }
    }
  }
  local_4 = advance;
  local_1dc = 1;
LAB_00829eaf:
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  ~eval_context((eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff880);
  return local_4;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& /*results*/, 
            error_reporter& reporter, 
            Json& /*patch*/) const final 
        {
            eval_context<Json> this_context(context, this->keyword_name());

            if (instance.is_int64() && value_.is_int64())
            {
                if (instance.template as<int64_t>() > value_.template as<int64_t>())
                {
                walk_result result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                        message_ + instance.template as<std::string>()));
                    if (result == walk_result::abort)
                    {
                        return result;
                    }
                }
            }
            else if (instance.is_uint64() && value_.is_uint64())
            {
                if (instance.template as<uint64_t>() > value_.template as<uint64_t>())
                {
                    walk_result result = reporter.error(this->make_validation_message(
                        this_context.eval_path(),
                        instance_location, 
                        message_ + instance.template as<std::string>()));
                    if (result == walk_result::abort)
                    {
                        return result;
                    }
                }
            }
            else if (instance.is_string_view() && instance.tag() == semantic_tag::bigint)
            {
                auto sv1 = instance.as_string_view();
                bigint n1 = bigint::from_string(sv1.data(), sv1.length());
                auto s2 = value_.as_string();
                bigint n2 = bigint::from_string(s2.data(), s2.length());
                if (n1 > n2)
                {
                    walk_result result = reporter.error(this->make_validation_message(
                        this_context.eval_path(),
                        instance_location, 
                        message_ + instance.template as<std::string>()));
                    if (result == walk_result::abort)
                    {
                        return result;
                    }
                }
            }
            else if (instance.is_number())
            {
                if (instance.template as<double>() > value_.template as<double>())
                {
                    walk_result result = reporter.error(this->make_validation_message(
                        this_context.eval_path(),
                        instance_location, 
                        message_ + instance.template as<std::string>()));
                    if (result == walk_result::abort)
                    {
                        return result;
                    }
                }
            }
            return walk_result::advance;
        }